

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

Array __thiscall notch::core::SoftmaxWithLoss::softmax(SoftmaxWithLoss *this,Array *input)

{
  size_t __n;
  float *pfVar1;
  float *extraout_RDX;
  double dVar2;
  Array AVar3;
  float local_54;
  ulong uStack_50;
  float expTotalInv;
  size_t i_1;
  ulong uStack_40;
  float expTotal;
  size_t i;
  float maxInput;
  size_t local_28;
  size_t nSize;
  Array *local_18;
  Array *input_local;
  Array *softmaxOutput;
  
  nSize._7_1_ = 0;
  nSize._0_4_ = 0;
  local_18 = input;
  input_local = (Array *)this;
  __n = std::valarray<float>::size(input);
  std::valarray<float>::valarray((valarray<float> *)this,(float *)&nSize,__n);
  local_28 = std::valarray<float>::size(local_18);
  i._0_4_ = std::numeric_limits<float>::min();
  for (uStack_40 = 0; uStack_40 < local_28; uStack_40 = uStack_40 + 1) {
    pfVar1 = std::valarray<float>::operator[](local_18,uStack_40);
    if ((float)i < *pfVar1) {
      pfVar1 = std::valarray<float>::operator[](local_18,uStack_40);
      i._0_4_ = *pfVar1;
    }
  }
  i_1._4_4_ = 0.0;
  for (uStack_50 = 0; uStack_50 < local_28; uStack_50 = uStack_50 + 1) {
    pfVar1 = std::valarray<float>::operator[](local_18,uStack_50);
    dVar2 = std::exp((double)(ulong)(uint)(*pfVar1 - (float)i));
    pfVar1 = std::valarray<float>::operator[]((valarray<float> *)this,uStack_50);
    *pfVar1 = SUB84(dVar2,0);
    pfVar1 = std::valarray<float>::operator[]((valarray<float> *)this,uStack_50);
    i_1._4_4_ = *pfVar1 + i_1._4_4_;
  }
  local_54 = 1.0 / i_1._4_4_;
  std::valarray<float>::operator*=((valarray<float> *)this,&local_54);
  AVar3._M_data = extraout_RDX;
  AVar3._M_size = (size_t)this;
  return AVar3;
}

Assistant:

static Array softmax(const Array &input) {
        Array softmaxOutput(0.0, input.size());
        size_t nSize = input.size();
        // a trick to avoid unbounded exponents
        float maxInput = std::numeric_limits<float>::min();
        for (size_t i = 0; i < nSize; ++i) {
            if (input[i] > maxInput) {
                maxInput = input[i];
            }
        }
        // calculate exponents
        float expTotal = 0.0;
        for (size_t i = 0; i < nSize; ++i) { // calculate exponents
            softmaxOutput[i] = std::exp(input[i] - maxInput);
            expTotal += softmaxOutput[i];
        }
        // normalize exponents
        float expTotalInv = 1.0/expTotal;
        softmaxOutput *= expTotalInv;
        return softmaxOutput;
    }